

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_ast_t * mpc_ast_add_root(mpc_ast_t *a)

{
  int iVar1;
  mpc_ast_t *pmVar2;
  mpc_ast_t **ppmVar3;
  
  if (a == (mpc_ast_t *)0x0) {
    pmVar2 = (mpc_ast_t *)0x0;
  }
  else {
    pmVar2 = a;
    if (1 < (uint)a->children_num) {
      pmVar2 = mpc_ast_new(">","");
      iVar1 = pmVar2->children_num;
      pmVar2->children_num = iVar1 + 1;
      ppmVar3 = (mpc_ast_t **)realloc(pmVar2->children,(long)iVar1 * 8 + 8);
      pmVar2->children = ppmVar3;
      ppmVar3[iVar1] = a;
    }
  }
  return pmVar2;
}

Assistant:

mpc_ast_t *mpc_ast_add_root(mpc_ast_t *a) {

  mpc_ast_t *r;

  if (a == NULL) { return a; }
  if (a->children_num == 0) { return a; }
  if (a->children_num == 1) { return a; }

  r = mpc_ast_new(">", "");
  mpc_ast_add_child(r, a);
  return r;
}